

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

wchar_t fl_utf8locale(void)

{
  char *pcVar1;
  char *pcVar2;
  
  if (fl_utf8locale::ret == L'\x02') {
    fl_utf8locale::ret = L'\x01';
    pcVar1 = getenv("LC_CTYPE");
    if (((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) &&
       ((pcVar1 = getenv("LC_ALL"), pcVar1 == (char *)0x0 || (*pcVar1 == '\0')))) {
      pcVar1 = getenv("LANG");
      if (pcVar1 == (char *)0x0) {
        return L'\x01';
      }
      if (*pcVar1 == '\0') {
        return L'\x01';
      }
    }
    pcVar2 = strstr(pcVar1,"utf");
    if (pcVar2 == (char *)0x0) {
      pcVar1 = strstr(pcVar1,"UTF");
      fl_utf8locale::ret = (wchar_t)(pcVar1 != (char *)0x0);
    }
    else {
      fl_utf8locale::ret = L'\x01';
    }
  }
  return fl_utf8locale::ret;
}

Assistant:

int fl_utf8locale(void) {
  static int ret = 2;
  if (ret == 2) {
#ifdef WIN32
    ret = GetACP() == CP_UTF8;
#else
    char* s;
    ret = 1; /* assume UTF-8 if no locale */
    if (((s = getenv("LC_CTYPE")) && *s) ||
	((s = getenv("LC_ALL"))   && *s) ||
	((s = getenv("LANG"))     && *s)) {
      ret = (strstr(s,"utf") || strstr(s,"UTF"));
    }
#endif
  }
  return ret;
}